

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[66]>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [66])

{
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  String argValues [1];
  String *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  ArrayDisposer *local_38;
  
  str<char_const(&)[66]>
            ((String *)&stack0xffffffffffffffb8,(kj *)params,
             (char (*) [66])CONCAT44(in_register_00000014,severity));
  argValues_00.size_ = in_stack_ffffffffffffffc0;
  argValues_00.ptr = in_stack_ffffffffffffffb8;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffffb8,argValues_00);
  if (in_stack_ffffffffffffffb8 != (String *)0x0) {
    (**local_38->_vptr_ArrayDisposer)
              (local_38,in_stack_ffffffffffffffb8,1,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffc0,0);
  }
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}